

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

void openjtalk_setFperiod(OpenJTalk *oj,uint i)

{
  ulong i_00;
  
  if (oj != (OpenJTalk *)0x0) {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    i_00 = (ulong)(i + (i == 0));
    oj->fperiod = i_00;
    Open_JTalk_set_fperiod(oj->open_jtalk,i_00);
    return;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setFperiod(OpenJTalk *oj, unsigned int i)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (i < 1)
	{
		i = 1;
	}
	oj->fperiod = i;
	Open_JTalk_set_fperiod(oj->open_jtalk, oj->fperiod);
}